

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  _Bool _Var1;
  _Bool _Var2;
  size_t n;
  long lVar3;
  size_t n_1;
  byte bVar4;
  ulong uVar5;
  _Bool sum [8];
  _Bool b [8];
  _Bool a [8];
  undefined8 uStack_30;
  byte local_28 [8];
  _Bool local_20 [8];
  _Bool local_18 [8];
  
  uStack_30 = 0x101187;
  printf("Please enter a and b as %d-bit binary numbers\n",8);
  uStack_30 = 0x10119d;
  input_binary(local_18,8,"a = ");
  uStack_30 = 0x1011b3;
  input_binary(local_20,8,"b = ");
  lVar3 = 0;
  bVar4 = 0;
LAB_001011b5:
  do {
    while( true ) {
      _Var1 = local_18[lVar3];
      _Var2 = local_20[lVar3];
      local_28[lVar3] = (bVar4 ^ _Var2 != _Var1) & 1;
      lVar3 = lVar3 + 1;
      if ((_Var2 != _Var1 & bVar4) == 0) break;
      bVar4 = 1;
      if (lVar3 == 8) {
        uStack_30 = 0x101216;
        printf(anon_var_dwarf_71);
LAB_00101216:
        uStack_30 = 0x101220;
        putchar(0x31);
LAB_00101220:
        lVar3 = 8;
        do {
          uStack_30 = 0x101232;
          putchar(local_28[lVar3 + -1] | 0x30);
          lVar3 = lVar3 + -1;
        } while (lVar3 != 0);
        uStack_30 = 0x101241;
        putchar(10);
        lVar3 = 0;
        uVar5 = 0;
        do {
          uVar5 = uVar5 | (ulong)local_28[lVar3] << ((byte)lVar3 & 0x3f);
          lVar3 = lVar3 + 1;
        } while (lVar3 != 8);
        uStack_30 = 0x101266;
        printf("  = %lu\n",uVar5);
        return 0;
      }
    }
    if (_Var1 != false) {
      bVar4 = _Var2;
      if (lVar3 == 8) {
        uStack_30 = 0x10127d;
        printf(anon_var_dwarf_71);
        if (_Var2 == false) goto LAB_00101220;
        goto LAB_00101216;
      }
      goto LAB_001011b5;
    }
    bVar4 = 0;
    if (lVar3 == 8) {
      uStack_30 = 0x101206;
      printf(anon_var_dwarf_71);
      goto LAB_00101220;
    }
  } while( true );
}

Assistant:

int main(int argc, char** argv) {
  bool a[N_BITS];
  bool b[N_BITS];
  bool sum[N_BITS];

  // Input the numbers
  printf("Please enter a and b as %d-bit binary numbers\n", N_BITS);
  input_binary(a, N_BITS, "a = ");
  input_binary(b, N_BITS, "b = ");
  bool overflow = sum_binary(a, b, N_BITS, sum);

  printf("\u03a3 = ");
  // Print the carry bit if necessary
  if (overflow) printf("1");
  // Print each bit (back in big endian)
  for (size_t n = 0; n < N_BITS; n++) {
    printf("%c", sum[N_BITS - n - 1] ? '1' : '0');
  }
  printf("\n");

#if N_BITS <= 64
  // Convert the number in base 10
  uint64_t sum_b10 = 0;
  for (size_t n = 0; n < N_BITS; n++) {
    sum_b10 |= (uint64_t)sum[n] << n;
  }
  printf("  = %" PRIu64 "\n", sum_b10);
#endif

  return 0;
}